

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_start_ext(mpack_writer_t *writer,int8_t exttype,uint32_t count)

{
  _Bool _Var1;
  size_t sVar2;
  uint32_t count_local;
  int8_t exttype_local;
  mpack_writer_t *writer_local;
  
  if (writer->version < mpack_version_current) {
    mpack_writer_flag_error(writer,mpack_error_bug);
  }
  else {
    mpack_writer_track_element(writer);
    if (count == 1) {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
        mpack_encode_fixext1(writer->current,exttype);
        writer->current = writer->current + 2;
      }
    }
    else if (count == 2) {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
        mpack_encode_fixext2(writer->current,exttype);
        writer->current = writer->current + 2;
      }
    }
    else if (count == 4) {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
        mpack_encode_fixext4(writer->current,exttype);
        writer->current = writer->current + 2;
      }
    }
    else if (count == 8) {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
        mpack_encode_fixext8(writer->current,exttype);
        writer->current = writer->current + 2;
      }
    }
    else if (count == 0x10) {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
        mpack_encode_fixext16(writer->current,exttype);
        writer->current = writer->current + 2;
      }
    }
    else if (count < 0x100) {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((2 < sVar2) || (_Var1 = mpack_writer_ensure(writer,3), _Var1)) {
        mpack_encode_ext8(writer->current,exttype,(uint8_t)count);
        writer->current = writer->current + 3;
      }
    }
    else if (count < 0x10000) {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((3 < sVar2) || (_Var1 = mpack_writer_ensure(writer,4), _Var1)) {
        mpack_encode_ext16(writer->current,exttype,(uint16_t)count);
        writer->current = writer->current + 4;
      }
    }
    else {
      sVar2 = mpack_writer_buffer_left(writer);
      if ((5 < sVar2) || (_Var1 = mpack_writer_ensure(writer,6), _Var1)) {
        mpack_encode_ext32(writer->current,exttype,count);
        writer->current = writer->current + 6;
      }
    }
    mpack_writer_track_push(writer,mpack_type_ext,(ulong)count);
  }
  return;
}

Assistant:

void mpack_start_ext(mpack_writer_t* writer, int8_t exttype, uint32_t count) {
    #if MPACK_COMPATIBILITY
    if (writer->version <= mpack_version_v4) {
        mpack_break("Ext types require spec version v5 or later. This writer is in v%i mode.", (int)writer->version);
        mpack_writer_flag_error(writer, mpack_error_bug);
        return;
    }
    #endif

    mpack_writer_track_element(writer);

    if (count == 1) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext1, MPACK_TAG_SIZE_FIXEXT1, exttype);
    } else if (count == 2) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext2, MPACK_TAG_SIZE_FIXEXT2, exttype);
    } else if (count == 4) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext4, MPACK_TAG_SIZE_FIXEXT4, exttype);
    } else if (count == 8) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext8, MPACK_TAG_SIZE_FIXEXT8, exttype);
    } else if (count == 16) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext16, MPACK_TAG_SIZE_FIXEXT16, exttype);
    } else if (count <= UINT8_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_ext8, MPACK_TAG_SIZE_EXT8, exttype, (uint8_t)count);
    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_ext16, MPACK_TAG_SIZE_EXT16, exttype, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_ext32, MPACK_TAG_SIZE_EXT32, exttype, (uint32_t)count);
    }

    mpack_writer_track_push(writer, mpack_type_ext, count);
}